

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

void luaK_settablesize(FuncState *fs,int pc,int ra,int asize,int hsize)

{
  uint *puVar1;
  int local_3c;
  int k;
  int rc;
  int extra;
  int rb;
  Instruction *inst;
  int hsize_local;
  int asize_local;
  int ra_local;
  int pc_local;
  FuncState *fs_local;
  
  puVar1 = fs->f->code + pc;
  if (hsize == 0) {
    local_3c = 0;
  }
  else {
    local_3c = luaO_ceillog2(hsize);
    local_3c = local_3c + 1;
  }
  *puVar1 = ra << 7 | 0x13U | local_3c << 0x10 | asize % 0x100 << 0x18 |
            (uint)(0 < asize / 0x100) << 0xf;
  puVar1[1] = asize / 0x100 << 7 | 0x52;
  return;
}

Assistant:

void luaK_settablesize (FuncState *fs, int pc, int ra, int asize, int hsize) {
  Instruction *inst = &fs->f->code[pc];
  int rb = (hsize != 0) ? luaO_ceillog2(hsize) + 1 : 0;  /* hash size */
  int extra = asize / (MAXARG_C + 1);  /* higher bits of array size */
  int rc = asize % (MAXARG_C + 1);  /* lower bits of array size */
  int k = (extra > 0);  /* true iff needs extra argument */
  *inst = CREATE_ABCk(OP_NEWTABLE, ra, rb, rc, k);
  *(inst + 1) = CREATE_Ax(OP_EXTRAARG, extra);
}